

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateArray(ExpressionEvalContext *ctx,ExprArray *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  _func_int *p_Var4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  ExprPointerLiteral *target;
  ExprBase *value;
  ExprBase *target_00;
  TypeRef *pTVar7;
  ExprBase *pEVar8;
  _func_int **pp_Var9;
  uint uVar10;
  undefined4 extraout_var_00;
  
  uVar10 = (ctx->stackFrames).count;
  if ((uVar10 == 0) || ((ctx->stackFrames).data[uVar10 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      target = AllocateTypeStorage(ctx,(expression->super_ExprBase).source,
                                   (expression->super_ExprBase).type);
      if (target != (ExprPointerLiteral *)0x0) {
        pTVar3 = (expression->super_ExprBase).type;
        if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x13)) {
          __assert_fail("arrayType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x3d5,"ExprBase *EvaluateArray(ExpressionEvalContext &, ExprArray *)");
        }
        pEVar8 = (expression->values).head;
        if (pEVar8 != (ExprBase *)0x0) {
          uVar10 = 0;
          do {
            value = Evaluate(ctx,pEVar8);
            if (value == (ExprBase *)0x0) goto LAB_0024ca76;
            pp_Var9 = (_func_int **)(target->ptr + uVar10);
            if (target->end < (_func_int *)((long)pp_Var9 + (long)pTVar3[1]._vptr_TypeBase[6])) {
              __assert_fail("storage->ptr + offset + arrayType->subType->size <= storage->end",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                            ,0x3e0,"ExprBase *EvaluateArray(ExpressionEvalContext &, ExprArray *)");
            }
            pAVar1 = ctx->ctx->allocator;
            iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x40);
            target_00 = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
            pSVar2 = (expression->super_ExprBase).source;
            pTVar7 = ExpressionContext::GetReferenceType
                               (ctx->ctx,(TypeBase *)pTVar3[1]._vptr_TypeBase);
            p_Var4 = pTVar3[1]._vptr_TypeBase[6];
            target_00->typeID = 0xc;
            target_00->source = pSVar2;
            target_00->type = &pTVar7->super_TypeBase;
            target_00->next = (ExprBase *)0x0;
            target_00->listed = false;
            target_00->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e8708;
            target_00[1]._vptr_ExprBase = pp_Var9;
            *(_func_int **)&target_00[1].typeID = (_func_int *)((long)pp_Var9 + (long)p_Var4);
            if ((long)p_Var4 < 0) {
              __assert_fail("ptr <= end",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.h"
                            ,0x279,
                            "ExprPointerLiteral::ExprPointerLiteral(SynBase *, TypeBase *, unsigned char *, unsigned char *)"
                           );
            }
            bVar5 = CreateStore(ctx,target_00,value);
            if (!bVar5) goto LAB_0024ca76;
            uVar10 = uVar10 + *(int *)(pTVar3[1]._vptr_TypeBase + 6);
            pEVar8 = pEVar8->next;
          } while (pEVar8 != (ExprBase *)0x0);
        }
        pEVar8 = CreateLoad(ctx,&target->super_ExprBase);
        if (pEVar8 != (ExprBase *)0x0) {
          pEVar8 = CheckType(&expression->super_ExprBase,pEVar8);
          return pEVar8;
        }
      }
LAB_0024ca76:
      pEVar8 = (ExprBase *)0x0;
    }
    else {
      pEVar8 = (ExprBase *)0x0;
      Report(ctx,"ERROR: instruction limit reached");
    }
  }
  else {
    pAVar1 = ctx->ctx->allocator;
    iVar6 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = pSVar2;
    pEVar8->type = pTVar3;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6b38;
  }
  return pEVar8;
}

Assistant:

ExprBase* EvaluateArray(ExpressionEvalContext &ctx, ExprArray *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprPointerLiteral *storage = AllocateTypeStorage(ctx, expression->source, expression->type);

	if(!storage)
		return NULL;

	TypeArray *arrayType = getType<TypeArray>(expression->type);

	assert(arrayType);

	unsigned offset = 0;

	for(ExprBase *value = expression->values.head; value; value = value->next)
	{
		ExprBase *element = Evaluate(ctx, value);

		if(!element)
			return NULL;

		assert(storage->ptr + offset + arrayType->subType->size <= storage->end);

		unsigned char *targetPtr = storage->ptr + offset;

		ExprPointerLiteral *target = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		if(!CreateStore(ctx, target, element))
			return NULL;

		offset += unsigned(arrayType->subType->size);
	}

	ExprBase *load = CreateLoad(ctx, storage);

	if(!load)
		return NULL;

	return CheckType(expression, load);
}